

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statusor_internal.h
# Opt level: O2

void __thiscall
absl::lts_20250127::internal_statusor::StatusOrData<google::protobuf::FeatureSetDefaults>::
~StatusOrData(StatusOrData<google::protobuf::FeatureSetDefaults> *this)

{
  anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::FeatureSetDefaults>_1 aVar1;
  
  aVar1 = this->field_0;
  Status::~Status((Status *)this);
  if (aVar1 == (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::FeatureSetDefaults>_1)0x1
     ) {
    google::protobuf::FeatureSetDefaults::~FeatureSetDefaults(&(this->field_1).data_);
    return;
  }
  return;
}

Assistant:

~StatusOrData() {
    if (ok()) {
      status_.~Status();
      data_.~T();
    } else {
      status_.~Status();
    }
  }